

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::ArrayFeatureType::MergePartialFromCodedStream
          (ArrayFeatureType *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint64 *puVar4;
  uint32 *puVar5;
  uint8 *puVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  uint32 uVar10;
  ArrayFeatureType_ShapeRange *this_00;
  ArrayFeatureType_EnumeratedShapes *this_01;
  pair<int,_int> pVar11;
  char cVar12;
  ulong uVar13;
  uint64 uVar14;
  uint32 local_3c;
  uint64 local_38;
  
LAB_001c92ac:
  pbVar3 = input->buffer_;
  uVar10 = 0;
  if (pbVar3 < input->buffer_end_) {
    bVar2 = *pbVar3;
    uVar13 = (ulong)bVar2;
    pbVar1 = pbVar3 + 1;
    uVar8 = (uint)bVar2;
    if ((char)bVar2 < '\x01') {
      uVar10 = (uint)bVar2;
      if ((input->buffer_end_ <= pbVar1) || (uVar10 = uVar8, (~(uint)*pbVar1 & uVar8) < 0x80))
      goto LAB_001c95db;
      uVar13 = (ulong)((uVar8 + (uint)*pbVar1 * 0x80) - 0x80);
      input->buffer_ = pbVar3 + 2;
    }
    else {
      input->buffer_ = pbVar1;
    }
    uVar13 = uVar13 | 0x100000000;
  }
  else {
LAB_001c95db:
    uVar10 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar10);
    uVar13 = 0;
    if (uVar10 - 1 < 0x3fff) {
      uVar13 = 0x100000000;
    }
    uVar13 = uVar10 | uVar13;
  }
  uVar10 = (uint32)uVar13;
  if ((uVar13 & 0x100000000) == 0) goto LAB_001c9309;
  uVar8 = (uint)(uVar13 >> 3) & 0x1fffffff;
  cVar12 = (char)uVar13;
  if (uVar8 < 0x1f) {
    if (uVar8 == 1) {
      if (cVar12 == '\b') {
        bVar7 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          (1,10,input,&this->shape_);
      }
      else {
        if ((uVar10 & 0xff) != 10) goto LAB_001c9309;
        bVar7 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          (input,&this->shape_);
      }
      goto LAB_001c9329;
    }
    if (uVar8 == 2) {
      if (cVar12 != '\x10') goto LAB_001c9309;
      pbVar3 = input->buffer_;
      if (pbVar3 < input->buffer_end_) {
        bVar2 = *pbVar3;
        uVar13 = (ulong)bVar2;
        uVar10 = (uint32)bVar2;
        if ((char)bVar2 < '\0') goto LAB_001c965b;
        input->buffer_ = pbVar3 + 1;
      }
      else {
        uVar10 = 0;
LAB_001c965b:
        uVar13 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar10);
        if ((long)uVar13 < 0) {
          return false;
        }
      }
      this->datatype_ = (int)uVar13;
      goto LAB_001c92ac;
    }
    if ((uVar8 == 0x15) && (cVar12 == -0x56)) {
      if (this->_oneof_case_[0] == 0x15) {
        this_01 = (this->ShapeFlexibility_).enumeratedshapes_;
      }
      else {
        clear_ShapeFlexibility(this);
        this->_oneof_case_[0] = 0x15;
        this_01 = (ArrayFeatureType_EnumeratedShapes *)operator_new(0x30);
        ArrayFeatureType_EnumeratedShapes::ArrayFeatureType_EnumeratedShapes(this_01);
        (this->ShapeFlexibility_).enumeratedshapes_ = this_01;
      }
      puVar6 = input->buffer_;
      if ((puVar6 < input->buffer_end_) && (iVar9 = (int)(char)*puVar6, -1 < iVar9)) {
        input->buffer_ = puVar6 + 1;
      }
      else {
        iVar9 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar9 < 0) {
          return false;
        }
      }
      pVar11 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar9);
      if ((long)pVar11 < 0) {
        return false;
      }
      bVar7 = ArrayFeatureType_EnumeratedShapes::MergePartialFromCodedStream(this_01,input);
      goto LAB_001c95c3;
    }
  }
  else if (uVar8 < 0x33) {
    if (uVar8 == 0x1f) {
      if (cVar12 == -6) {
        if (this->_oneof_case_[0] == 0x1f) {
          this_00 = (this->ShapeFlexibility_).shaperange_;
        }
        else {
          clear_ShapeFlexibility(this);
          this->_oneof_case_[0] = 0x1f;
          this_00 = (ArrayFeatureType_ShapeRange *)operator_new(0x30);
          ArrayFeatureType_ShapeRange::ArrayFeatureType_ShapeRange(this_00);
          (this->ShapeFlexibility_).shaperange_ = this_00;
        }
        puVar6 = input->buffer_;
        if ((puVar6 < input->buffer_end_) && (iVar9 = (int)(char)*puVar6, -1 < iVar9)) {
          input->buffer_ = puVar6 + 1;
        }
        else {
          iVar9 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar9 < 0) {
            return false;
          }
        }
        pVar11 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar9);
        if ((long)pVar11 < 0) {
          return false;
        }
        bVar7 = ArrayFeatureType_ShapeRange::MergePartialFromCodedStream(this_00,input);
LAB_001c95c3:
        if (bVar7 == false) {
          return false;
        }
        bVar7 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                          (input,pVar11.first);
        goto LAB_001c9329;
      }
    }
    else if ((uVar8 == 0x29) && (cVar12 == 'H')) {
      this->_oneof_case_[1] = 0;
      pbVar3 = input->buffer_;
      if (pbVar3 < input->buffer_end_) {
        bVar2 = *pbVar3;
        uVar13 = (ulong)bVar2;
        uVar10 = (uint32)bVar2;
        if ((char)bVar2 < '\0') goto LAB_001c961d;
        input->buffer_ = pbVar3 + 1;
      }
      else {
        uVar10 = 0;
LAB_001c961d:
        uVar13 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar10);
        if ((long)uVar13 < 0) {
          return false;
        }
      }
      (this->defaultOptionalValue_).intdefaultvalue_ = (int32)uVar13;
      this->_oneof_case_[1] = 0x29;
      goto LAB_001c92ac;
    }
  }
  else if (uVar8 == 0x33) {
    if (cVar12 == -99) {
      this->_oneof_case_[1] = 0;
      puVar5 = (uint32 *)input->buffer_;
      if (*(int *)&input->buffer_end_ - (int)puVar5 < 4) {
        bVar7 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_3c);
        uVar10 = local_3c;
        if (!bVar7) {
          return false;
        }
      }
      else {
        uVar10 = *puVar5;
        input->buffer_ = (uint8 *)(puVar5 + 1);
      }
      *(uint32 *)&this->defaultOptionalValue_ = uVar10;
      this->_oneof_case_[1] = 0x33;
      goto LAB_001c92ac;
    }
  }
  else if ((uVar8 == 0x3d) && (cVar12 == -0x17)) {
    this->_oneof_case_[1] = 0;
    puVar4 = (uint64 *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar4 < 8) {
      bVar7 = google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback(input,&local_38);
      uVar14 = local_38;
      if (!bVar7) {
        return false;
      }
    }
    else {
      uVar14 = *puVar4;
      input->buffer_ = (uint8 *)(puVar4 + 1);
    }
    *(uint64 *)&(this->defaultOptionalValue_).intdefaultvalue_ = uVar14;
    this->_oneof_case_[1] = 0x3d;
    goto LAB_001c92ac;
  }
LAB_001c9309:
  if (uVar10 == 0) {
    return true;
  }
  if ((uVar10 & 7) == 4) {
    return true;
  }
  bVar7 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar10);
LAB_001c9329:
  if (bVar7 == false) {
    return false;
  }
  goto LAB_001c92ac;
}

Assistant:

bool ArrayFeatureType::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ArrayFeatureType)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated int64 shape = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, this->mutable_shape())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(8u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 1, 10u, input, this->mutable_shape())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ArrayFeatureType.ArrayDataType dataType = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_datatype(static_cast< ::CoreML::Specification::ArrayFeatureType_ArrayDataType >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ArrayFeatureType.EnumeratedShapes enumeratedShapes = 21;
      case 21: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(170u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_enumeratedshapes()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ArrayFeatureType.ShapeRange shapeRange = 31;
      case 31: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(250u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_shaperange()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 intDefaultValue = 41;
      case 41: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(328u)) {
          clear_defaultOptionalValue();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &defaultOptionalValue_.intdefaultvalue_)));
          set_has_intdefaultvalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float floatDefaultValue = 51;
      case 51: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(413u)) {
          clear_defaultOptionalValue();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &defaultOptionalValue_.floatdefaultvalue_)));
          set_has_floatdefaultvalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // double doubleDefaultValue = 61;
      case 61: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(489u)) {
          clear_defaultOptionalValue();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &defaultOptionalValue_.doubledefaultvalue_)));
          set_has_doubledefaultvalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ArrayFeatureType)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ArrayFeatureType)
  return false;
#undef DO_
}